

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O3

size_t __thiscall ON_FixedSizePool::BlockElementCount(ON_FixedSizePool *this,void *block)

{
  void **ppvVar1;
  
  if ((block != (void *)0x0) && (this->m_sizeof_element != 0)) {
    ppvVar1 = &this->m_al_element_array;
    if (this->m_al_count == 0) {
      ppvVar1 = (void **)((long)block + 8);
    }
    if (this->m_al_block != block) {
      ppvVar1 = (void **)((long)block + 8);
    }
    return (ulong)((long)*ppvVar1 + (-0x10 - (long)block)) / this->m_sizeof_element;
  }
  return 0;
}

Assistant:

size_t ON_FixedSizePool::BlockElementCount( const void* block ) const
{
  // returns number of items currently allocated from block
  if ( 0 == block || m_sizeof_element <= 0 )
    return 0;

  const char* block_end
    = (block == m_al_block && m_al_count > 0)
    ? ((const char*)m_al_element_array)
    : *((const char**)(((const char*)block)+sizeof(void*)));

  const char* block_head = (((const char*)block) + 2*sizeof(void*));

  return (block_end - block_head)/m_sizeof_element;
}